

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval-comp.cpp
# Opt level: O3

void __thiscall IntervalComp_plus_Test::TestBody(IntervalComp_plus_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> ex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _func_int **message;
  ExprPtr EVar1;
  ExprPtr range1;
  ExprPtr e;
  undefined1 local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  ExprPtr local_50;
  ExprPtr local_40;
  ExprPtr local_30;
  ExprPtr local_20;
  
  mathiu::impl::operator____s(local_70,0x21facb);
  mathiu::impl::operator____s((char *)&local_40,0x21f647);
  mathiu::impl::operator+((impl *)&local_30,(ExprPtr *)local_70,&local_40);
  if (local_40.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  mathiu::impl::operator____s(local_70,0x21facb);
  local_50.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_50.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_50.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_50.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
  local_50.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_50.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  *(undefined4 *)
   &local_50.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = 1;
  *(undefined1 *)
   &local_50.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[4]._M_use_count = 0;
  local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  (local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_use_count = 1;
  (local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_M_weak_count = 1;
  (local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00263778;
  local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi + 1);
  *(undefined4 *)
   &local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = 2;
  *(undefined1 *)
   &local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[4]._M_use_count = 0;
  mathiu::impl::interval((impl *)local_80,(ExprPtr *)(local_60 + 0x10),true,&local_20,false);
  EVar1 = mathiu::impl::functionRange
                    ((impl *)&local_40,&local_30,(ExprPtr *)local_70,(ExprPtr *)local_80);
  ex = EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
    ex._M_pi = extraout_RDX;
  }
  if (local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ex._M_pi = extraout_RDX_00;
  }
  if (local_50.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    ex._M_pi = extraout_RDX_01;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
    ex._M_pi = extraout_RDX_02;
  }
  mathiu::impl::toString_abi_cxx11_((string *)local_70,(impl *)&local_40,(ExprPtr *)ex._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
            ((internal *)local_80,"toString(range1)","\"(COInterval (+ 1 y) (+ 2 y))\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
             (char (*) [29])"(COInterval (+ 1 y) (+ 2 y))");
  if ((element_type *)local_70._0_8_ != (element_type *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60._0_8_ + 1);
  }
  if (local_80[0] == (impl)0x0) {
    testing::Message::Message((Message *)local_70);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x21d6c4;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(local_78._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_60 + 0x10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/interval-comp.cpp"
               ,10,(char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_60 + 0x10),(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_60 + 0x10));
    if ((element_type *)local_70._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_70._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._M_pi
                );
  }
  if (local_40.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

TEST(IntervalComp, plus)
{
    auto const e = "x"_s + "y"_s;
    auto const range1 = functionRange(e, "x"_s, interval(1_i, true, 2_i, false));
    EXPECT_EQ(toString(range1), "(COInterval (+ 1 y) (+ 2 y))");
}